

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

int64_t gnu_sparse_10_atol(archive_read *a,tar *tar,int64_t *remaining,int64_t *unconsumed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ssize_t local_78;
  wchar_t digit;
  wchar_t base;
  ssize_t bytes_read;
  char *p;
  int64_t last_digit_limit;
  int64_t limit;
  int64_t l;
  int64_t *unconsumed_local;
  int64_t *remaining_local;
  tar *tar_local;
  archive_read *a_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
  last_digit_limit = SUB168((auVar1 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(10),0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
  p = SUB168((auVar2 << 0x40 | ZEXT816(0x7fffffffffffffff)) % SEXT816(10),0);
  l = (int64_t)unconsumed;
  unconsumed_local = remaining;
  remaining_local = (int64_t *)tar;
  tar_local = (tar *)a;
  while( true ) {
    if (*unconsumed_local < 100) {
      local_78 = *unconsumed_local;
    }
    else {
      local_78 = 100;
    }
    _digit = readline((archive_read *)tar_local,(tar *)remaining_local,(char **)&bytes_read,local_78
                      ,(int64_t *)l);
    if (_digit < 1) break;
    *unconsumed_local = *unconsumed_local - _digit;
    if (*(char *)bytes_read != '#') {
      limit = 0;
      while( true ) {
        if (_digit < 1) {
          return -0x14;
        }
        if (*(char *)bytes_read == '\n') break;
        if ((*(char *)bytes_read < '0') || ('9' < *(char *)bytes_read)) {
          return -0x14;
        }
        if ((last_digit_limit < limit) ||
           ((limit == last_digit_limit && ((long)p < (long)(*(char *)bytes_read + -0x30))))) {
          limit = 0x7fffffffffffffff;
        }
        else {
          limit = limit * 10 + (long)(*(char *)bytes_read + -0x30);
        }
        bytes_read = bytes_read + 1;
        _digit = _digit + -1;
      }
      return limit;
    }
  }
  return -0x1e;
}

Assistant:

static int64_t
gnu_sparse_10_atol(struct archive_read *a, struct tar *tar,
    int64_t *remaining, int64_t *unconsumed)
{
	int64_t l, limit, last_digit_limit;
	const char *p;
	ssize_t bytes_read;
	int base, digit;

	base = 10;
	limit = INT64_MAX / base;
	last_digit_limit = INT64_MAX % base;

	/*
	 * Skip any lines starting with '#'; GNU tar specs
	 * don't require this, but they should.
	 */
	do {
		bytes_read = readline(a, tar, &p,
			(ssize_t)tar_min(*remaining, 100), unconsumed);
		if (bytes_read <= 0)
			return (ARCHIVE_FATAL);
		*remaining -= bytes_read;
	} while (p[0] == '#');

	l = 0;
	while (bytes_read > 0) {
		if (*p == '\n')
			return (l);
		if (*p < '0' || *p >= '0' + base)
			return (ARCHIVE_WARN);
		digit = *p - '0';
		if (l > limit || (l == limit && digit > last_digit_limit))
			l = INT64_MAX; /* Truncate on overflow. */
		else
			l = (l * base) + digit;
		p++;
		bytes_read--;
	}
	/* TODO: Error message. */
	return (ARCHIVE_WARN);
}